

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_draw_list_stroke_poly_line
               (nk_draw_list *list,nk_vec2 *points,uint points_count,nk_color color,
               nk_draw_list_stroke closed,float thickness,nk_anti_aliasing aliasing)

{
  nk_convert_config *config;
  float *pfVar1;
  nk_vec2 nVar2;
  uint uVar3;
  nk_buffer *b;
  void *pvVar4;
  nk_vec2 pos;
  nk_vec2 pos_00;
  nk_vec2 pos_01;
  nk_vec2 pos_02;
  short sVar5;
  short sVar6;
  void *pvVar7;
  nk_draw_index *pnVar8;
  float *pfVar9;
  nk_draw_index nVar10;
  ulong uVar11;
  ulong uVar12;
  nk_draw_index nVar13;
  nk_size nVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  nk_draw_index nVar18;
  float fVar19;
  uint uVar20;
  nk_draw_index nVar21;
  nk_draw_index nVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  bool bVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  nk_colorf color_00;
  nk_colorf color_01;
  nk_colorf color_02;
  nk_colorf color_03;
  nk_colorf color_04;
  nk_colorf color_05;
  nk_colorf color_06;
  nk_colorf color_07;
  nk_colorf color_08;
  nk_colorf color_09;
  nk_colorf color_10;
  
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x1ffe,
                  "void nk_draw_list_stroke_poly_line(struct nk_draw_list *, const struct nk_vec2 *, const unsigned int, struct nk_color, enum nk_draw_list_stroke, float, enum nk_anti_aliasing)"
                 );
  }
  if (1 < points_count) {
    config = &list->config;
    fVar28 = (list->config).global_alpha;
    uVar15 = (ulong)points_count;
    uVar20 = points_count - 1;
    uVar12 = (ulong)uVar20;
    uVar23 = uVar15;
    if (closed == NK_STROKE_OPEN) {
      uVar23 = uVar12;
    }
    color_10.r = (float)((uint)color & 0xff) * 0.003921569;
    fVar27 = (float)((uint)color >> 8 & 0xff) * 0.003921569;
    color_10.g = fVar27;
    color_00.b = (float)((uint)color >> 0x10 & 0xff) * 0.003921569;
    fVar28 = (float)((int)((float)((int)((float)((uint)color >> 0x18) * fVar28) & 0xff) * fVar28) &
                    0xff) * 0.003921569;
    color_08.a = fVar28;
    color_08.b = color_00.b;
    uVar3 = list->vertex_count;
    if (aliasing == NK_ANTI_ALIASING_ON) {
      lVar24 = 0xc;
      if (1.0 < thickness) {
        lVar24 = 0x12;
      }
      uVar16 = points_count * 3;
      if (1.0 < thickness) {
        uVar16 = points_count * 4;
      }
      pvVar7 = nk_draw_list_alloc_vertices(list,(ulong)uVar16);
      pnVar8 = nk_draw_list_alloc_elements(list,lVar24 * uVar23);
      if ((pvVar7 != (void *)0x0) && (pnVar8 != (nk_draw_index *)0x0)) {
        b = list->vertices;
        if (b == (nk_buffer *)0x0) {
          __assert_fail("buffer",
                        "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                        ,0x1a1f,
                        "void nk_buffer_mark(struct nk_buffer *, enum nk_buffer_allocation_type)");
        }
        pvVar4 = (b->memory).ptr;
        b->marker[0].active = 1;
        b->marker[0].offset = b->allocated;
        pfVar9 = (float *)nk_buffer_alloc(b,NK_BUFFER_FRONT,
                                          ((ulong)(1.0 < thickness) * 0x10 + 0x18) * uVar15,4);
        if (pfVar9 != (float *)0x0) {
          pvVar7 = (void *)((long)pvVar7 + ((long)(list->vertices->memory).ptr - (long)pvVar4));
          if (uVar23 != 0) {
            uVar11 = 1;
            do {
              uVar17 = uVar11;
              if (uVar15 == uVar11) {
                uVar17 = 0;
              }
              fVar33 = points[uVar17].x - points[uVar11 - 1].x;
              fVar34 = points[uVar17].y - points[uVar11 - 1].y;
              fVar35 = fVar33 * fVar33 + fVar34 * fVar34;
              fVar19 = 1.0;
              if ((fVar35 != 0.0) || (NAN(fVar35))) {
                fVar19 = (float)(0x5f375a84 - ((uint)fVar35 >> 1));
                fVar19 = (fVar35 * -0.5 * fVar19 * fVar19 + 1.5) * fVar19;
              }
              pfVar9[uVar11 * 2 + -2] = fVar34 * fVar19;
              pfVar9[uVar11 * 2 + -1] = -fVar33 * fVar19;
              bVar26 = uVar11 != uVar23;
              uVar11 = uVar11 + 1;
            } while (bVar26);
          }
          if (closed == NK_STROKE_OPEN) {
            *(undefined8 *)(pfVar9 + uVar12 * 2) =
                 *(undefined8 *)(pfVar9 + (ulong)(points_count - 2) * 2);
          }
          pfVar1 = pfVar9 + uVar15 * 2;
          if (thickness <= 1.0) {
            if (closed == NK_STROKE_OPEN) {
              fVar28 = *pfVar9;
              fVar19 = pfVar9[1];
              *(ulong *)pfVar1 = CONCAT44(points->y + fVar19,points->x + fVar28);
              *(ulong *)(pfVar1 + 2) = CONCAT44(points->y - fVar19,points->x - fVar28);
              fVar28 = pfVar9[uVar12 * 2];
              fVar19 = pfVar9[uVar12 * 2 + 1];
              *(ulong *)(pfVar1 + (ulong)(uVar20 * 2) * 2) =
                   CONCAT44(points[uVar12].y + fVar19,points[uVar12].x + fVar28);
              *(ulong *)(pfVar1 + (ulong)(uVar20 * 2) * 2 + 2) =
                   CONCAT44(points[uVar12].y - fVar19,points[uVar12].x - fVar28);
            }
            if (uVar23 != 0) {
              uVar12 = 1;
              uVar20 = uVar3;
              do {
                uVar11 = uVar12;
                uVar16 = uVar20 + 3;
                if (uVar15 == uVar12) {
                  uVar11 = 0;
                  uVar16 = uVar3;
                }
                fVar28 = (pfVar9[uVar12 * 2 + -2] + pfVar9[uVar11 * 2]) * 0.5;
                fVar19 = (pfVar9[uVar12 * 2 + -1] + pfVar9[uVar11 * 2 + 1]) * 0.5;
                fVar33 = fVar28 * fVar28 + fVar19 * fVar19;
                if (1e-06 < fVar33) {
                  fVar33 = 1.0 / fVar33;
                  fVar34 = 100.0;
                  if (fVar33 <= 100.0) {
                    fVar34 = fVar33;
                  }
                  fVar28 = fVar28 * fVar34;
                  fVar19 = fVar19 * fVar34;
                }
                *(ulong *)(pfVar1 + uVar11 * 4) =
                     CONCAT44(points[uVar11].y + fVar19,points[uVar11].x + fVar28);
                *(ulong *)(pfVar1 + uVar11 * 4 + 2) =
                     CONCAT44(points[uVar11].y - fVar19,points[uVar11].x - fVar28);
                nVar10 = (nk_draw_index)uVar16;
                *pnVar8 = nVar10;
                nVar18 = (nk_draw_index)uVar20;
                pnVar8[1] = nVar18;
                pnVar8[2] = nVar18 + 2;
                pnVar8[3] = nVar18 + 2;
                pnVar8[4] = nVar10 + 2;
                pnVar8[5] = nVar10;
                pnVar8[6] = nVar10 + 1;
                pnVar8[7] = nVar18 + 1;
                pnVar8[8] = nVar18;
                pnVar8[9] = nVar18;
                pnVar8[10] = nVar10;
                pnVar8[0xb] = nVar10 + 1;
                pnVar8 = pnVar8 + 0xc;
                bVar26 = uVar12 != uVar23;
                uVar12 = uVar12 + 1;
                uVar20 = uVar16;
              } while (bVar26);
            }
            lVar24 = 0;
            do {
              nVar2 = (list->config).null.uv;
              color_08.r = color_10.r;
              color_08.g = fVar27;
              pvVar7 = nk_draw_vertex(pvVar7,config,*(nk_vec2 *)((long)&points->x + lVar24),nVar2,
                                      color_08);
              color_09.b = color_00.b;
              color_09.r = color_10.r;
              color_09.g = fVar27;
              color_09.a = 0.0;
              pvVar7 = nk_draw_vertex(pvVar7,config,
                                      *(nk_vec2 *)((long)pfVar9 + lVar24 * 2 + uVar15 * 8),nVar2,
                                      color_09);
              color_10.b = color_00.b;
              color_10.a = 0.0;
              pvVar7 = nk_draw_vertex(pvVar7,config,
                                      *(nk_vec2 *)((long)pfVar9 + lVar24 * 2 + uVar15 * 8 + 8),nVar2
                                      ,color_10);
              lVar24 = lVar24 + 8;
            } while ((uVar15 + (uVar15 == 0)) * 8 != lVar24);
          }
          else {
            fVar19 = (thickness + -1.0) * 0.5;
            if (closed == NK_STROKE_OPEN) {
              fVar33 = fVar19 + 1.0;
              fVar34 = fVar33 * *pfVar9;
              fVar35 = fVar33 * pfVar9[1];
              fVar30 = *pfVar9 * fVar19;
              fVar32 = pfVar9[1] * fVar19;
              *(ulong *)pfVar1 = CONCAT44(points->y + fVar35,points->x + fVar34);
              *(ulong *)(pfVar1 + 2) = CONCAT44(points->y + fVar32,points->x + fVar30);
              *(ulong *)(pfVar1 + 4) = CONCAT44(points->y - fVar32,points->x - fVar30);
              *(ulong *)(pfVar1 + 6) = CONCAT44(points->y - fVar35,points->x - fVar34);
              fVar34 = fVar33 * pfVar9[uVar12 * 2];
              fVar33 = fVar33 * pfVar9[uVar12 * 2 + 1];
              fVar30 = pfVar9[uVar12 * 2] * fVar19;
              fVar35 = pfVar9[uVar12 * 2 + 1] * fVar19;
              uVar11 = (ulong)(uVar20 * 4);
              *(ulong *)(pfVar1 + uVar11 * 2) =
                   CONCAT44(points[uVar12].y + fVar33,points[uVar12].x + fVar34);
              *(ulong *)(pfVar1 + uVar11 * 2 + 2) =
                   CONCAT44(points[uVar12].y + fVar35,points[uVar12].x + fVar30);
              *(ulong *)(pfVar1 + uVar11 * 2 + 4) =
                   CONCAT44(points[uVar12].y - fVar35,points[uVar12].x - fVar30);
              *(ulong *)(pfVar1 + uVar11 * 2 + 6) =
                   CONCAT44(points[uVar12].y - fVar33,points[uVar12].x - fVar34);
            }
            if (uVar23 != 0) {
              uVar12 = 1;
              uVar20 = uVar3;
              do {
                uVar11 = uVar12;
                uVar16 = uVar20 + 4;
                if (uVar15 == uVar12) {
                  uVar11 = 0;
                  uVar16 = uVar3;
                }
                fVar33 = (pfVar9[uVar12 * 2 + -2] + pfVar9[uVar11 * 2]) * 0.5;
                fVar34 = (pfVar9[uVar12 * 2 + -1] + pfVar9[uVar11 * 2 + 1]) * 0.5;
                fVar35 = fVar33 * fVar33 + fVar34 * fVar34;
                if (1e-06 < fVar35) {
                  fVar35 = 1.0 / fVar35;
                  fVar30 = 100.0;
                  if (fVar35 <= 100.0) {
                    fVar30 = fVar35;
                  }
                  fVar33 = fVar33 * fVar30;
                  fVar34 = fVar34 * fVar30;
                }
                fVar35 = (fVar19 + 1.0) * fVar33;
                fVar30 = (fVar19 + 1.0) * fVar34;
                *(ulong *)(pfVar1 + uVar11 * 8) =
                     CONCAT44(points[uVar11].y + fVar30,points[uVar11].x + fVar35);
                *(ulong *)(pfVar1 + uVar11 * 8 + 2) =
                     CONCAT44(points[uVar11].y + fVar34 * fVar19,points[uVar11].x + fVar19 * fVar33)
                ;
                *(ulong *)(pfVar1 + uVar11 * 8 + 4) =
                     CONCAT44(points[uVar11].y - fVar34 * fVar19,points[uVar11].x - fVar19 * fVar33)
                ;
                *(ulong *)(pfVar1 + uVar11 * 8 + 6) =
                     CONCAT44(points[uVar11].y - fVar30,points[uVar11].x - fVar35);
                nVar10 = (nk_draw_index)uVar16;
                nVar21 = nVar10 + 1;
                *pnVar8 = nVar21;
                nVar18 = (nk_draw_index)uVar20;
                pnVar8[1] = nVar18 + 1;
                nVar22 = nVar18 + 2;
                pnVar8[2] = nVar22;
                pnVar8[3] = nVar22;
                nVar13 = nVar10 + 2;
                pnVar8[4] = nVar13;
                pnVar8[5] = nVar21;
                pnVar8[6] = nVar21;
                pnVar8[7] = nVar18 + 1;
                pnVar8[8] = nVar18;
                pnVar8[9] = nVar18;
                pnVar8[10] = nVar10;
                pnVar8[0xb] = nVar21;
                pnVar8[0xc] = nVar13;
                pnVar8[0xd] = nVar22;
                pnVar8[0xe] = nVar18 + 3;
                pnVar8[0xf] = nVar18 + 3;
                pnVar8[0x10] = nVar10 + 3;
                pnVar8[0x11] = nVar13;
                pnVar8 = pnVar8 + 0x12;
                bVar26 = uVar12 != uVar23;
                uVar12 = uVar12 + 1;
                uVar20 = uVar16;
              } while (bVar26);
            }
            lVar24 = uVar15 * 8;
            lVar25 = 0;
            do {
              nVar2 = (list->config).null.uv;
              color_00.r = color_10.r;
              color_00.g = fVar27;
              color_00.a = 0.0;
              pvVar7 = nk_draw_vertex(pvVar7,config,*(nk_vec2 *)((long)pfVar9 + lVar25 + lVar24),
                                      nVar2,color_00);
              color_01.b = color_00.b;
              color_01.a = fVar28;
              color_01.r = color_10.r;
              color_01.g = fVar27;
              pvVar7 = nk_draw_vertex(pvVar7,config,*(nk_vec2 *)((long)pfVar9 + lVar25 + lVar24 + 8)
                                      ,nVar2,color_01);
              color_02.b = color_00.b;
              color_02.a = fVar28;
              color_02.r = color_10.r;
              color_02.g = fVar27;
              pvVar7 = nk_draw_vertex(pvVar7,config,
                                      *(nk_vec2 *)((long)pfVar9 + lVar25 + lVar24 + 0x10),nVar2,
                                      color_02);
              color_03.b = color_00.b;
              color_03.r = color_10.r;
              color_03.g = fVar27;
              color_03.a = 0.0;
              pvVar7 = nk_draw_vertex(pvVar7,config,
                                      *(nk_vec2 *)((long)pfVar9 + lVar25 + lVar24 + 0x18),nVar2,
                                      color_03);
              lVar25 = lVar25 + 0x20;
            } while ((uVar15 + (uVar15 == 0)) * 0x20 != lVar25);
          }
          nk_buffer_reset(list->vertices,NK_BUFFER_FRONT);
          return;
        }
        __assert_fail("normals",
                      "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                      ,0x2029,
                      "void nk_draw_list_stroke_poly_line(struct nk_draw_list *, const struct nk_vec2 *, const unsigned int, struct nk_color, enum nk_draw_list_stroke, float, enum nk_anti_aliasing)"
                     );
      }
    }
    else {
      pvVar7 = nk_draw_list_alloc_vertices(list,uVar23 * 4);
      pnVar8 = nk_draw_list_alloc_elements(list,uVar23 * 6);
      if ((uVar23 != 0 && pvVar7 != (void *)0x0) && pnVar8 != (nk_draw_index *)0x0) {
        lVar24 = 1;
        nVar14 = 0;
        do {
          lVar25 = 0;
          if (uVar15 * 4 - 4 != nVar14) {
            lVar25 = lVar24;
          }
          fVar19 = *(float *)((long)&points->x + nVar14 * 2);
          fVar33 = *(float *)((long)&points->y + nVar14 * 2);
          fVar34 = points[lVar25].x;
          fVar35 = points[lVar25].y;
          fVar29 = fVar34 - fVar19;
          fVar31 = fVar35 - fVar33;
          fVar32 = fVar29 * fVar29 + fVar31 * fVar31;
          fVar30 = 1.0;
          if ((fVar32 != 0.0) || (NAN(fVar32))) {
            fVar30 = (float)(0x5f375a84 - ((uint)fVar32 >> 1));
            fVar30 = (fVar32 * -0.5 * fVar30 * fVar30 + 1.5) * fVar30;
          }
          nVar2 = (list->config).null.uv;
          fVar32 = fVar29 * fVar30 * thickness * 0.5;
          fVar30 = fVar31 * fVar30 * thickness * 0.5;
          color_04.b = color_00.b;
          color_04.a = fVar28;
          color_04.r = color_10.r;
          color_04.g = fVar27;
          pos.y = fVar33 - fVar32;
          pos.x = fVar19 + fVar30;
          pvVar7 = nk_draw_vertex(pvVar7,config,pos,nVar2,color_04);
          color_05.b = color_00.b;
          color_05.a = fVar28;
          color_05.r = color_10.r;
          color_05.g = fVar27;
          pos_00.y = fVar35 - fVar32;
          pos_00.x = fVar34 + fVar30;
          pvVar7 = nk_draw_vertex(pvVar7,config,pos_00,nVar2,color_05);
          color_06.b = color_00.b;
          color_06.a = fVar28;
          color_06.r = color_10.r;
          color_06.g = fVar27;
          pos_01.y = fVar35 + fVar32;
          pos_01.x = fVar34 - fVar30;
          pvVar7 = nk_draw_vertex(pvVar7,config,pos_01,nVar2,color_06);
          color_07.b = color_00.b;
          color_07.a = fVar28;
          color_07.r = color_10.r;
          color_07.g = fVar27;
          pos_02.y = fVar32 + fVar33;
          pos_02.x = fVar19 - fVar30;
          pvVar7 = nk_draw_vertex(pvVar7,config,pos_02,nVar2,color_07);
          sVar5 = (short)uVar3;
          sVar6 = (short)nVar14;
          *pnVar8 = sVar5 + sVar6;
          pnVar8[1] = sVar5 + 1 + sVar6;
          nVar10 = sVar5 + 2 + sVar6;
          pnVar8[2] = nVar10;
          pnVar8[3] = sVar5 + sVar6;
          pnVar8[4] = nVar10;
          pnVar8[5] = sVar5 + sVar6 + 3;
          pnVar8 = pnVar8 + 6;
          nVar14 = nVar14 + 4;
          lVar24 = lVar24 + 1;
        } while (uVar23 * 4 != nVar14);
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_stroke_poly_line(struct nk_draw_list *list, const struct nk_vec2 *points,
    const unsigned int points_count, struct nk_color color, enum nk_draw_list_stroke closed,
    float thickness, enum nk_anti_aliasing aliasing)
{
    nk_size count;
    int thick_line;
    struct nk_colorf col;
    struct nk_colorf col_trans;
    NK_ASSERT(list);
    if (!list || points_count < 2) return;

    color.a = (nk_byte)((float)color.a * list->config.global_alpha);
    count = points_count;
    if (!closed) count = points_count-1;
    thick_line = thickness > 1.0f;

#ifdef NK_INCLUDE_COMMAND_USERDATA
    nk_draw_list_push_userdata(list, list->userdata);
#endif

    color.a = (nk_byte)((float)color.a * list->config.global_alpha);
    nk_color_fv(&col.r, color);
    col_trans = col;
    col_trans.a = 0;

    if (aliasing == NK_ANTI_ALIASING_ON) {
        /* ANTI-ALIASED STROKE */
        const float AA_SIZE = 1.0f;
        NK_STORAGE const nk_size pnt_align = NK_ALIGNOF(struct nk_vec2);
        NK_STORAGE const nk_size pnt_size = sizeof(struct nk_vec2);

        /* allocate vertices and elements  */
        nk_size i1 = 0;
        nk_size vertex_offset;
        nk_size index = list->vertex_count;

        const nk_size idx_count = (thick_line) ?  (count * 18) : (count * 12);
        const nk_size vtx_count = (thick_line) ? (points_count * 4): (points_count *3);

        void *vtx = nk_draw_list_alloc_vertices(list, vtx_count);
        nk_draw_index *ids = nk_draw_list_alloc_elements(list, idx_count);

        nk_size size;
        struct nk_vec2 *normals, *temp;
        if (!vtx || !ids) return;

        /* temporary allocate normals + points */
        vertex_offset = (nk_size)((nk_byte*)vtx - (nk_byte*)list->vertices->memory.ptr);
        nk_buffer_mark(list->vertices, NK_BUFFER_FRONT);
        size = pnt_size * ((thick_line) ? 5 : 3) * points_count;
        normals = (struct nk_vec2*) nk_buffer_alloc(list->vertices, NK_BUFFER_FRONT, size, pnt_align);
        NK_ASSERT(normals);
        if (!normals) return;
        temp = normals + points_count;

        /* make sure vertex pointer is still correct */
        vtx = (void*)((nk_byte*)list->vertices->memory.ptr + vertex_offset);

        /* calculate normals */
        for (i1 = 0; i1 < count; ++i1) {
            const nk_size i2 = ((i1 + 1) == points_count) ? 0 : (i1 + 1);
            struct nk_vec2 diff = nk_vec2_sub(points[i2], points[i1]);
            float len;

            /* vec2 inverted length  */
            len = nk_vec2_len_sqr(diff);
            if (len != 0.0f)
                len = nk_inv_sqrt(len);
            else len = 1.0f;

            diff = nk_vec2_muls(diff, len);
            normals[i1].x = diff.y;
            normals[i1].y = -diff.x;
        }

        if (!closed)
            normals[points_count-1] = normals[points_count-2];

        if (!thick_line) {
            nk_size idx1, i;
            if (!closed) {
                struct nk_vec2 d;
                temp[0] = nk_vec2_add(points[0], nk_vec2_muls(normals[0], AA_SIZE));
                temp[1] = nk_vec2_sub(points[0], nk_vec2_muls(normals[0], AA_SIZE));
                d = nk_vec2_muls(normals[points_count-1], AA_SIZE);
                temp[(points_count-1) * 2 + 0] = nk_vec2_add(points[points_count-1], d);
                temp[(points_count-1) * 2 + 1] = nk_vec2_sub(points[points_count-1], d);
            }

            /* fill elements */
            idx1 = index;
            for (i1 = 0; i1 < count; i1++) {
                struct nk_vec2 dm;
                float dmr2;
                nk_size i2 = ((i1 + 1) == points_count) ? 0 : (i1 + 1);
                nk_size idx2 = ((i1+1) == points_count) ? index: (idx1 + 3);

                /* average normals */
                dm = nk_vec2_muls(nk_vec2_add(normals[i1], normals[i2]), 0.5f);
                dmr2 = dm.x * dm.x + dm.y* dm.y;
                if (dmr2 > 0.000001f) {
                    float scale = 1.0f/dmr2;
                    scale = NK_MIN(100.0f, scale);
                    dm = nk_vec2_muls(dm, scale);
                }

                dm = nk_vec2_muls(dm, AA_SIZE);
                temp[i2*2+0] = nk_vec2_add(points[i2], dm);
                temp[i2*2+1] = nk_vec2_sub(points[i2], dm);

                ids[0] = (nk_draw_index)(idx2 + 0); ids[1] = (nk_draw_index)(idx1+0);
                ids[2] = (nk_draw_index)(idx1 + 2); ids[3] = (nk_draw_index)(idx1+2);
                ids[4] = (nk_draw_index)(idx2 + 2); ids[5] = (nk_draw_index)(idx2+0);
                ids[6] = (nk_draw_index)(idx2 + 1); ids[7] = (nk_draw_index)(idx1+1);
                ids[8] = (nk_draw_index)(idx1 + 0); ids[9] = (nk_draw_index)(idx1+0);
                ids[10]= (nk_draw_index)(idx2 + 0); ids[11]= (nk_draw_index)(idx2+1);
                ids += 12;
                idx1 = idx2;
            }

            /* fill vertices */
            for (i = 0; i < points_count; ++i) {
                const struct nk_vec2 uv = list->config.null.uv;
                vtx = nk_draw_vertex(vtx, &list->config, points[i], uv, col);
                vtx = nk_draw_vertex(vtx, &list->config, temp[i*2+0], uv, col_trans);
                vtx = nk_draw_vertex(vtx, &list->config, temp[i*2+1], uv, col_trans);
            }
        } else {
            nk_size idx1, i;
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;
            if (!closed) {
                struct nk_vec2 d1 = nk_vec2_muls(normals[0], half_inner_thickness + AA_SIZE);
                struct nk_vec2 d2 = nk_vec2_muls(normals[0], half_inner_thickness);

                temp[0] = nk_vec2_add(points[0], d1);
                temp[1] = nk_vec2_add(points[0], d2);
                temp[2] = nk_vec2_sub(points[0], d2);
                temp[3] = nk_vec2_sub(points[0], d1);

                d1 = nk_vec2_muls(normals[points_count-1], half_inner_thickness + AA_SIZE);
                d2 = nk_vec2_muls(normals[points_count-1], half_inner_thickness);

                temp[(points_count-1)*4+0] = nk_vec2_add(points[points_count-1], d1);
                temp[(points_count-1)*4+1] = nk_vec2_add(points[points_count-1], d2);
                temp[(points_count-1)*4+2] = nk_vec2_sub(points[points_count-1], d2);
                temp[(points_count-1)*4+3] = nk_vec2_sub(points[points_count-1], d1);
            }

            /* add all elements */
            idx1 = index;
            for (i1 = 0; i1 < count; ++i1) {
                struct nk_vec2 dm_out, dm_in;
                const nk_size i2 = ((i1+1) == points_count) ? 0: (i1 + 1);
                nk_size idx2 = ((i1+1) == points_count) ? index: (idx1 + 4);

                /* average normals */
                struct nk_vec2 dm = nk_vec2_muls(nk_vec2_add(normals[i1], normals[i2]), 0.5f);
                float dmr2 = dm.x * dm.x + dm.y* dm.y;
                if (dmr2 > 0.000001f) {
                    float scale = 1.0f/dmr2;
                    scale = NK_MIN(100.0f, scale);
                    dm = nk_vec2_muls(dm, scale);
                }

                dm_out = nk_vec2_muls(dm, ((half_inner_thickness) + AA_SIZE));
                dm_in = nk_vec2_muls(dm, half_inner_thickness);
                temp[i2*4+0] = nk_vec2_add(points[i2], dm_out);
                temp[i2*4+1] = nk_vec2_add(points[i2], dm_in);
                temp[i2*4+2] = nk_vec2_sub(points[i2], dm_in);
                temp[i2*4+3] = nk_vec2_sub(points[i2], dm_out);

                /* add indexes */
                ids[0] = (nk_draw_index)(idx2 + 1); ids[1] = (nk_draw_index)(idx1+1);
                ids[2] = (nk_draw_index)(idx1 + 2); ids[3] = (nk_draw_index)(idx1+2);
                ids[4] = (nk_draw_index)(idx2 + 2); ids[5] = (nk_draw_index)(idx2+1);
                ids[6] = (nk_draw_index)(idx2 + 1); ids[7] = (nk_draw_index)(idx1+1);
                ids[8] = (nk_draw_index)(idx1 + 0); ids[9] = (nk_draw_index)(idx1+0);
                ids[10]= (nk_draw_index)(idx2 + 0); ids[11] = (nk_draw_index)(idx2+1);
                ids[12]= (nk_draw_index)(idx2 + 2); ids[13] = (nk_draw_index)(idx1+2);
                ids[14]= (nk_draw_index)(idx1 + 3); ids[15] = (nk_draw_index)(idx1+3);
                ids[16]= (nk_draw_index)(idx2 + 3); ids[17] = (nk_draw_index)(idx2+2);
                ids += 18;
                idx1 = idx2;
            }

            /* add vertices */
            for (i = 0; i < points_count; ++i) {
                const struct nk_vec2 uv = list->config.null.uv;
                vtx = nk_draw_vertex(vtx, &list->config, temp[i*4+0], uv, col_trans);
                vtx = nk_draw_vertex(vtx, &list->config, temp[i*4+1], uv, col);
                vtx = nk_draw_vertex(vtx, &list->config, temp[i*4+2], uv, col);
                vtx = nk_draw_vertex(vtx, &list->config, temp[i*4+3], uv, col_trans);
            }
        }
        /* free temporary normals + points */
        nk_buffer_reset(list->vertices, NK_BUFFER_FRONT);
    } else {
        /* NON ANTI-ALIASED STROKE */
        nk_size i1 = 0;
        nk_size idx = list->vertex_count;
        const nk_size idx_count = count * 6;
        const nk_size vtx_count = count * 4;
        void *vtx = nk_draw_list_alloc_vertices(list, vtx_count);
        nk_draw_index *ids = nk_draw_list_alloc_elements(list, idx_count);
        if (!vtx || !ids) return;

        for (i1 = 0; i1 < count; ++i1) {
            float dx, dy;
            const struct nk_vec2 uv = list->config.null.uv;
            const nk_size i2 = ((i1+1) == points_count) ? 0 : i1 + 1;
            const struct nk_vec2 p1 = points[i1];
            const struct nk_vec2 p2 = points[i2];
            struct nk_vec2 diff = nk_vec2_sub(p2, p1);
            float len;

            /* vec2 inverted length  */
            len = nk_vec2_len_sqr(diff);
            if (len != 0.0f)
                len = nk_inv_sqrt(len);
            else len = 1.0f;
            diff = nk_vec2_muls(diff, len);

            /* add vertices */
            dx = diff.x * (thickness * 0.5f);
            dy = diff.y * (thickness * 0.5f);

            vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(p1.x + dy, p1.y - dx), uv, col);
            vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(p2.x + dy, p2.y - dx), uv, col);
            vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(p2.x - dy, p2.y + dx), uv, col);
            vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(p1.x - dy, p1.y + dx), uv, col);

            ids[0] = (nk_draw_index)(idx+0); ids[1] = (nk_draw_index)(idx+1);
            ids[2] = (nk_draw_index)(idx+2); ids[3] = (nk_draw_index)(idx+0);
            ids[4] = (nk_draw_index)(idx+2); ids[5] = (nk_draw_index)(idx+3);

            ids += 6;
            idx += 4;
        }
    }
}